

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O0

btBroadphasePair * __thiscall
btHashedOverlappingPairCache::internalAddPair
          (btHashedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1)

{
  uint proxyId1_00;
  uint proxyId2_00;
  uint hash_00;
  int iVar1;
  int iVar2;
  int iVar3;
  btBroadphasePair *pbVar4;
  int *piVar5;
  btBroadphaseProxy *in_RDX;
  btBroadphaseProxy *in_RSI;
  btHashedOverlappingPairCache *in_RDI;
  int newCapacity;
  void *mem;
  int oldCapacity;
  int count;
  btBroadphasePair *pair;
  int hash;
  int proxyId2;
  int proxyId1;
  btAlignedObjectArray<btBroadphasePair> *in_stack_ffffffffffffff80;
  btBroadphaseProxy *in_stack_ffffffffffffffa0;
  btHashedOverlappingPairCache *in_stack_ffffffffffffffa8;
  uint local_2c;
  btBroadphaseProxy *local_20;
  btBroadphaseProxy *local_18 [2];
  btBroadphasePair *local_8;
  
  local_20 = in_RDX;
  local_18[0] = in_RSI;
  if (in_RDX->m_uniqueId < in_RSI->m_uniqueId) {
    btSwap<btBroadphaseProxy*>(local_18,&local_20);
  }
  proxyId1_00 = btBroadphaseProxy::getUid(local_18[0]);
  proxyId2_00 = btBroadphaseProxy::getUid(local_20);
  hash_00 = getHash(in_RDI,proxyId1_00,proxyId2_00);
  iVar1 = btAlignedObjectArray<btBroadphasePair>::capacity(&in_RDI->m_overlappingPairArray);
  local_2c = hash_00 & iVar1 - 1U;
  local_8 = internalFindPair(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                             (btBroadphaseProxy *)in_RDI,hash_00);
  if (local_8 == (btBroadphasePair *)0x0) {
    iVar1 = btAlignedObjectArray<btBroadphasePair>::size(&in_RDI->m_overlappingPairArray);
    iVar2 = btAlignedObjectArray<btBroadphasePair>::capacity(&in_RDI->m_overlappingPairArray);
    pbVar4 = btAlignedObjectArray<btBroadphasePair>::expandNonInitializing
                       (in_stack_ffffffffffffff80);
    if (in_RDI->m_ghostPairCallback != (btOverlappingPairCallback *)0x0) {
      (*in_RDI->m_ghostPairCallback->_vptr_btOverlappingPairCallback[2])
                (in_RDI->m_ghostPairCallback,local_18[0],local_20);
    }
    iVar3 = btAlignedObjectArray<btBroadphasePair>::capacity(&in_RDI->m_overlappingPairArray);
    if (iVar2 < iVar3) {
      growTables((btHashedOverlappingPairCache *)CONCAT44(iVar1,iVar2));
      local_2c = getHash(in_RDI,proxyId1_00,proxyId2_00);
      iVar2 = btAlignedObjectArray<btBroadphasePair>::capacity(&in_RDI->m_overlappingPairArray);
      local_2c = local_2c & iVar2 - 1U;
    }
    pbVar4 = (btBroadphasePair *)btBroadphasePair::operator_new(0x20,pbVar4);
    btBroadphasePair::btBroadphasePair(pbVar4,local_18[0],local_20);
    pbVar4->m_algorithm = (btCollisionAlgorithm *)0x0;
    (pbVar4->field_3).m_internalTmpValue = 0;
    piVar5 = btAlignedObjectArray<int>::operator[](&in_RDI->m_hashTable,local_2c);
    iVar2 = *piVar5;
    piVar5 = btAlignedObjectArray<int>::operator[](&in_RDI->m_next,iVar1);
    *piVar5 = iVar2;
    piVar5 = btAlignedObjectArray<int>::operator[](&in_RDI->m_hashTable,local_2c);
    *piVar5 = iVar1;
    local_8 = pbVar4;
  }
  return local_8;
}

Assistant:

btBroadphasePair* btHashedOverlappingPairCache::internalAddPair(btBroadphaseProxy* proxy0, btBroadphaseProxy* proxy1)
{
	if(proxy0->m_uniqueId>proxy1->m_uniqueId) 
		btSwap(proxy0,proxy1);
	int proxyId1 = proxy0->getUid();
	int proxyId2 = proxy1->getUid();

	/*if (proxyId1 > proxyId2) 
		btSwap(proxyId1, proxyId2);*/

	int	hash = static_cast<int>(getHash(static_cast<unsigned int>(proxyId1),static_cast<unsigned int>(proxyId2)) & (m_overlappingPairArray.capacity()-1));	// New hash value with new mask


	btBroadphasePair* pair = internalFindPair(proxy0, proxy1, hash);
	if (pair != NULL)
	{
		return pair;
	}
	/*for(int i=0;i<m_overlappingPairArray.size();++i)
		{
		if(	(m_overlappingPairArray[i].m_pProxy0==proxy0)&&
			(m_overlappingPairArray[i].m_pProxy1==proxy1))
			{
			printf("Adding duplicated %u<>%u\r\n",proxyId1,proxyId2);
			internalFindPair(proxy0, proxy1, hash);
			}
		}*/
	int count = m_overlappingPairArray.size();
	int oldCapacity = m_overlappingPairArray.capacity();
	void* mem = &m_overlappingPairArray.expandNonInitializing();

	//this is where we add an actual pair, so also call the 'ghost'
	if (m_ghostPairCallback)
		m_ghostPairCallback->addOverlappingPair(proxy0,proxy1);

	int newCapacity = m_overlappingPairArray.capacity();

	if (oldCapacity < newCapacity)
	{
		growTables();
		//hash with new capacity
		hash = static_cast<int>(getHash(static_cast<unsigned int>(proxyId1),static_cast<unsigned int>(proxyId2)) & (m_overlappingPairArray.capacity()-1));
	}
	
	pair = new (mem) btBroadphasePair(*proxy0,*proxy1);
//	pair->m_pProxy0 = proxy0;
//	pair->m_pProxy1 = proxy1;
	pair->m_algorithm = 0;
	pair->m_internalTmpValue = 0;
	

	m_next[count] = m_hashTable[hash];
	m_hashTable[hash] = count;

	return pair;
}